

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_sha1.c
# Opt level: O2

void HMAC_SHA1_Final(uint8_t *digest,HMAC_SHA1_CTX *ctx)

{
  SHA1_Final(digest,(SHA_CTX *)ctx);
  SHA1_Init((SHA_CTX *)ctx);
  SHA1_Update((SHA_CTX *)ctx,ctx->k_opad,0x40);
  SHA1_Update((SHA_CTX *)ctx,digest,0x14);
  SHA1_Final(digest,(SHA_CTX *)ctx);
  return;
}

Assistant:

void HMAC_SHA1_Final(uint8_t digest[20], HMAC_SHA1_CTX *ctx) {
  SHA1_Final(digest, &ctx->sha1ctx);           /* finish up 1st pass */

  /* perform outer SHA1 */
  SHA1_Init(&ctx->sha1ctx);                    /* init context for 2nd pass */
  SHA1_Update(&ctx->sha1ctx, ctx->k_opad, 64); /* start with outer pad */
  SHA1_Update(&ctx->sha1ctx, digest, 20);      /* then results of 1st hash */
  SHA1_Final(digest, &ctx->sha1ctx);           /* finish up 2nd pass */
}